

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

string * __thiscall
CppGenerator::genProductString_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,TDNode *node,
          dyn_bitset *contributingViews,prod_bitset *product)

{
  Function *f;
  Attribute *pAVar1;
  size_t sVar2;
  View *pVVar3;
  ostream *poVar4;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  ulong attID;
  long lVar6;
  ulong uVar7;
  CppGenerator *this_00;
  ulong f_id;
  ulong uVar8;
  ulong v_id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string freeVarString;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&freeVarString);
  f_id = 0;
  do {
    if (f_id == 0x5dc) {
      if (__return_storage_ptr__->_M_string_length == 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::pop_back();
      }
      return __return_storage_ptr__;
    }
    if (((product->super__Base_bitset<24UL>)._M_w[f_id >> 6] >> (f_id & 0x3f) & 1) != 0) {
      f = QueryCompiler::getFunction
                    ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,f_id);
      this_00 = (CppGenerator *)0x1e2d3a;
      std::__cxx11::string::string
                ((string *)&freeVarString,"",(allocator *)&stack0xffffffffffffff90);
      attID = 0;
LAB_001b85b0:
      if (attID != 100) {
        uVar8 = attID >> 6;
        uVar7 = 1L << ((byte)attID & 0x3f);
        if (((f->_fVars).super__Base_bitset<2UL>._M_w[uVar8] >> (attID & 0x3f) & 1) != 0) {
          if (((node->_bag).super__Base_bitset<2UL>._M_w[uVar8] & uVar7) == 0) {
            lVar6 = 0;
            v_id = 0;
            do {
              sVar2 = QueryCompiler::numberOfViews
                                ((this->_qc).
                                 super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
              if (sVar2 <= v_id) {
                std::operator<<((ostream *)&std::cerr,
                                "The loop hasn\'t been found - THIS IS A MISTAKE\n");
                poVar4 = std::operator<<((ostream *)&std::cout,(string *)node);
                std::endl<char,std::char_traits<char>>(poVar4);
                pbVar5 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                                         product);
                std::endl<char,std::char_traits<char>>(pbVar5);
                pAVar1 = TreeDecomposition::getAttribute
                                   ((this->_td).
                                    super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr,attID);
                poVar4 = std::operator<<((ostream *)&std::cout,(string *)&pAVar1->_name);
                std::endl<char,std::char_traits<char>>(poVar4);
                exit(1);
              }
              if (((contributingViews->m_bits).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[v_id >> 6] >> (v_id & 0x3f) & 1) != 0) {
                pVVar3 = QueryCompiler::getView
                                   ((this->_qc).
                                    super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr,v_id);
                if (((pVVar3->_fVars).super__Base_bitset<2UL>._M_w[uVar8] & uVar7) != 0)
                goto LAB_001b86b5;
              }
              v_id = v_id + 1;
              lVar6 = lVar6 + 0x20;
            } while( true );
          }
          std::operator+(&local_b0,&node->_name,"Tuple.");
          pAVar1 = TreeDecomposition::getAttribute
                             ((this->_td).
                              super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,attID);
          std::operator+(&local_90,&local_b0,&pAVar1->_name);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xffffffffffffff90,&local_90,",");
          this_00 = (CppGenerator *)&stack0xffffffffffffff90;
          std::__cxx11::string::append((string *)&freeVarString);
          std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_b0);
        }
        goto LAB_001b8742;
      }
      std::__cxx11::string::pop_back();
      getFunctionString(&local_90,this_00,f,&freeVarString);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff90,&local_90,"*");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&freeVarString);
    }
    f_id = f_id + 1;
  } while( true );
LAB_001b86b5:
  std::operator+(&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(this->viewName->_M_dataplus)._M_p + lVar6),"Tuple.");
  pAVar1 = TreeDecomposition::getAttribute
                     ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,attID);
  std::operator+(&local_90,&local_b0,&pAVar1->_name);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffff90,&local_90,",");
  this_00 = (CppGenerator *)&stack0xffffffffffffff90;
  std::__cxx11::string::append((string *)&freeVarString);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
LAB_001b8742:
  attID = attID + 1;
  goto LAB_001b85b0;
}

Assistant:

std::string CppGenerator::genProductString(
    const TDNode& node, const dyn_bitset& contributingViews, const prod_bitset& product)
{
    std::string productString = "";
    // Turn each function into string
    for (size_t f = 0; f < NUM_OF_FUNCTIONS; f++)
    {
        if (product[f])
        {
            Function* function = _qc->getFunction(f);
            const var_bitset& functionVars = function->_fVars;

            std::string freeVarString = "";

            for (size_t v = 0; v < NUM_OF_VARIABLES; ++v)
            {                        
                if (functionVars[v])
                {
                    if (node._bag[v])
                    {
                        freeVarString += node._name+"Tuple."+
                            _td->getAttribute(v)->_name+",";                            
                    }
                    else
                    {
                        bool notFound = true;
                        for (size_t incViewID = 0; incViewID <
                                 _qc->numberOfViews(); ++incViewID)
                        {
                            if (contributingViews[incViewID])
                            {
                                View* incView = _qc->getView(incViewID);

                                if (incView->_fVars[v])
                                {
                                    freeVarString += viewName[incViewID]+"Tuple."+
                                        _td->getAttribute(v)->_name+",";
                                    notFound = false;
                                    break;
                                }                  
                            }
                        }

                        if (notFound)
                        {
                            ERROR("The loop hasn't been found - THIS IS A MISTAKE\n");
                            std::cout << node._name << std::endl;
                            std::cout << product << std::endl;
                            std::cout << _td->getAttribute(v)->_name << std::endl;
                            exit(1);
                        }
                    }
                }
            }

            freeVarString.pop_back();
            productString += getFunctionString(function,freeVarString)+"*";
        }
    }
            
    if (!productString.empty())
        productString.pop_back();
    else
        productString += "1";
    
    return productString;    
}